

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisDecodeOptionalInstructionParts
          (ZydisDecoderState *state,ZydisDecodedInstruction *instruction,
          ZydisInstructionEncodingInfo *info)

{
  ZyanU8 ZVar1;
  int iVar2;
  ZyanStatus ZVar3;
  bool local_71;
  bool local_61;
  ZyanStatus status_047620348_5;
  ZyanStatus status_047620348_4;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanU8 sib_byte;
  ZyanU8 displacement_size;
  ZyanU8 has_sib;
  ZyanStatus status_047620348;
  ZyanU8 modrm_byte;
  ZydisDecoderContext *context;
  ZydisInstructionEncodingInfo *info_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderState *state_local;
  
  context = (ZydisDecoderContext *)info;
  info_local = (ZydisInstructionEncodingInfo *)instruction;
  instruction_local = (ZydisDecodedInstruction *)state;
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xc93,
                  "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                 );
  }
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xc94,
                  "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                 );
  }
  if (info == (ZydisInstructionEncodingInfo *)0x0) {
    __assert_fail("info",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xc95,
                  "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                 );
  }
  _status_047620348 = state->context;
  if ((info->flags & 1) != 0) {
    if ((instruction->raw).modrm.offset == '\0') {
      (instruction->raw).modrm.offset = instruction->length;
      status_047620348_1 = ZydisInputNext(state,instruction,&has_sib);
      if ((status_047620348_1 & 0x80000000) != 0) {
        return status_047620348_1;
      }
      ZydisDecodeModRM((ZydisDecodedInstruction *)info_local,has_sib);
    }
    if (((ulong)context->definition & 0x10) == 0) {
      status_047620348_2._3_1_ = false;
      status_047620348_2._2_1_ = '\0';
      ZVar1 = info_local[1].imm[1].size[0];
      if (ZVar1 == '\x10') {
        switch(info_local[0x12].disp.size[2]) {
        case '\0':
          if (info_local[0x12].imm[0].size[1] == '\x06') {
            status_047620348_2._2_1_ = '\x10';
          }
          break;
        case '\x01':
          status_047620348_2._2_1_ = '\b';
          break;
        case '\x02':
          status_047620348_2._2_1_ = '\x10';
          break;
        case '\x03':
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xcbb,
                        "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                       );
        }
      }
      else {
        if ((ZVar1 != ' ') && (ZVar1 != '@')) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xcdb,
                        "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                       );
        }
        local_61 = false;
        if (info_local[0x12].disp.size[2] != '\x03') {
          local_61 = info_local[0x12].imm[0].size[1] == '\x04';
        }
        status_047620348_2._3_1_ = local_61;
        switch(info_local[0x12].disp.size[2]) {
        case '\0':
          if (info_local[0x12].imm[0].size[1] == '\x05') {
            iVar2._0_1_ = info_local->flags;
            iVar2._1_3_ = info_local->disp;
            if (iVar2 == 0) {
              *(ulong *)info_local[2].imm = *(ulong *)info_local[2].imm | 0x80;
            }
            status_047620348_2._2_1_ = ' ';
          }
          break;
        case '\x01':
          status_047620348_2._2_1_ = '\b';
          break;
        case '\x02':
          status_047620348_2._2_1_ = ' ';
          break;
        case '\x03':
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xcd7,
                        "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                       );
        }
      }
      if ((bool)status_047620348_2._3_1_ != false) {
        info_local[0x12].imm[1].size[1] = info_local->imm[0].is_relative;
        ZVar3 = ZydisInputNext((ZydisDecoderState *)instruction_local,
                               (ZydisDecodedInstruction *)info_local,
                               (ZyanU8 *)((long)&status_047620348_2 + 1));
        if ((ZVar3 & 0x80000000) != 0) {
          return ZVar3;
        }
        ZydisDecodeSIB((ZydisDecodedInstruction *)info_local,status_047620348_2._1_1_);
        if ((info_local[0x12].imm[1].size[0] == '\x05') &&
           (status_047620348_2._2_1_ = ' ', info_local[0x12].disp.size[2] == '\x01')) {
          status_047620348_2._2_1_ = '\b';
        }
      }
      if ((status_047620348_2._2_1_ != '\0') &&
         (ZVar3 = ZydisReadDisplacement
                            ((ZydisDecoderState *)instruction_local,
                             (ZydisDecodedInstruction *)info_local,status_047620348_2._2_1_),
         (ZVar3 & 0x80000000) != 0)) {
        return ZVar3;
      }
    }
    local_71 = true;
    if (info_local[0x12].disp.size[2] != '\x03') {
      local_71 = ((ulong)context->definition & 0x10) != 0;
    }
    (_status_047620348->reg_info).is_mod_reg = local_71;
  }
  if ((((ulong)context->definition & 2) == 0) ||
     (state_local._4_4_ =
           ZydisReadDisplacement
                     ((ZydisDecoderState *)instruction_local,(ZydisDecodedInstruction *)info_local,
                      *(ZyanU8 *)
                       ((long)&context->definition + (ulong)_status_047620348->easz_index + 1)),
     (state_local._4_4_ & 0x80000000) == 0)) {
    if (((ulong)context->definition & 4) != 0) {
      if (context->eosz_index != '\0') {
        *(ulong *)info_local[2].imm = *(ulong *)info_local[2].imm | 0x80;
      }
      ZVar3 = ZydisReadImmediate((ZydisDecoderState *)instruction_local,
                                 (ZydisDecodedInstruction *)info_local,'\0',
                                 *(ZyanU8 *)
                                  ((long)&context->definition +
                                  (ulong)_status_047620348->eosz_index + 4),
                                 *(ZyanBool *)((long)&context->definition + 7),context->eosz_index);
      if ((ZVar3 & 0x80000000) != 0) {
        return ZVar3;
      }
    }
    if (((ulong)context->definition & 8) != 0) {
      if (((ulong)context->definition & 2) != 0) {
        __assert_fail("!(info->flags & 0x02)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xd05,
                      "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                     );
      }
      ZVar3 = ZydisReadImmediate((ZydisDecoderState *)instruction_local,
                                 (ZydisDecodedInstruction *)info_local,'\x01',
                                 (&context->easz_index)[_status_047620348->eosz_index],
                                 (context->vector_unified).X,(context->vector_unified).B);
      if ((ZVar3 & 0x80000000) != 0) {
        return ZVar3;
      }
    }
    state_local._4_4_ = 0x100000;
  }
  return state_local._4_4_;
}

Assistant:

static ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, const ZydisInstructionEncodingInfo* info)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(info);

    ZydisDecoderContext* context = state->context;

    if (info->flags & ZYDIS_INSTR_ENC_FLAG_HAS_MODRM)
    {
        if (!instruction->raw.modrm.offset)
        {
            instruction->raw.modrm.offset = instruction->length;
            ZyanU8 modrm_byte;
            ZYAN_CHECK(ZydisInputNext(state, instruction, &modrm_byte));
            ZydisDecodeModRM(instruction, modrm_byte);
        }

        if (!(info->flags & ZYDIS_INSTR_ENC_FLAG_FORCE_REG_FORM))
        {
            ZyanU8 has_sib = 0;
            ZyanU8 displacement_size = 0;
            switch (instruction->address_width)
            {
            case 16:
                switch (instruction->raw.modrm.mod)
                {
                case 0:
                    if (instruction->raw.modrm.rm == 6)
                    {
                        displacement_size = 16;
                    }
                    break;
                case 1:
                    displacement_size = 8;
                    break;
                case 2:
                    displacement_size = 16;
                    break;
                case 3:
                    break;
                default:
                    ZYAN_UNREACHABLE;
                }
                break;
            case 32:
            case 64:
                has_sib =
                    (instruction->raw.modrm.mod != 3) && (instruction->raw.modrm.rm == 4);
                switch (instruction->raw.modrm.mod)
                {
                case 0:
                    if (instruction->raw.modrm.rm == 5)
                    {
                        if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)
                        {
                            instruction->attributes |= ZYDIS_ATTRIB_IS_RELATIVE;
                        }
                        displacement_size = 32;
                    }
                    break;
                case 1:
                    displacement_size = 8;
                    break;
                case 2:
                    displacement_size = 32;
                    break;
                case 3:
                    break;
                default:
                    ZYAN_UNREACHABLE;
                }
                break;
            default:
                ZYAN_UNREACHABLE;
            }
            if (has_sib)
            {
                instruction->raw.sib.offset = instruction->length;
                ZyanU8 sib_byte;
                ZYAN_CHECK(ZydisInputNext(state, instruction, &sib_byte));
                ZydisDecodeSIB(instruction, sib_byte);
                if (instruction->raw.sib.base == 5)
                {
                    displacement_size = (instruction->raw.modrm.mod == 1) ? 8 : 32;
                }
            }
            if (displacement_size)
            {
                ZYAN_CHECK(ZydisReadDisplacement(state, instruction, displacement_size));
            }
        }

        context->reg_info.is_mod_reg = (instruction->raw.modrm.mod == 3) ||
                                       (info->flags & ZYDIS_INSTR_ENC_FLAG_FORCE_REG_FORM);
    }

    if (info->flags & ZYDIS_INSTR_ENC_FLAG_HAS_DISP)
    {
        ZYAN_CHECK(ZydisReadDisplacement(
            state, instruction, info->disp.size[context->easz_index]));
    }

    if (info->flags & ZYDIS_INSTR_ENC_FLAG_HAS_IMM0)
    {
        if (info->imm[0].is_relative)
        {
            instruction->attributes |= ZYDIS_ATTRIB_IS_RELATIVE;
        }
        ZYAN_CHECK(ZydisReadImmediate(state, instruction, 0,
            info->imm[0].size[context->eosz_index], info->imm[0].is_signed,
            info->imm[0].is_relative));
    }

    if (info->flags & ZYDIS_INSTR_ENC_FLAG_HAS_IMM1)
    {
        ZYAN_ASSERT(!(info->flags & ZYDIS_INSTR_ENC_FLAG_HAS_DISP));
        ZYAN_CHECK(ZydisReadImmediate(state, instruction, 1,
            info->imm[1].size[context->eosz_index], info->imm[1].is_signed,
            info->imm[1].is_relative));
    }

    return ZYAN_STATUS_SUCCESS;
}